

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long>::on_num
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long> *this)

{
  char *pcVar1;
  char cVar2;
  byte bVar3;
  ushort uVar4;
  basic_format_specs<char> *pbVar5;
  bool bVar6;
  bool bVar7;
  long lVar8;
  char cVar9;
  uint uVar10;
  buffer_appender<char> bVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  buffer<char> *buf;
  _Alloc_hider _Var16;
  char *pcVar17;
  ulong uVar18;
  uint uVar19;
  int iVar20;
  size_type sVar21;
  uint uVar22;
  char *pcVar23;
  uint uVar24;
  string groups;
  char digits [40];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  string local_298;
  char local_278 [48];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_248;
  
  grouping_impl<char>(&local_298,(locale_ref)(this->locale).locale_);
  if (local_298._M_string_length == 0) {
    on_dec(this);
    goto LAB_00212a06;
  }
  cVar9 = thousands_sep_impl<char>((locale_ref)(this->locale).locale_);
  if (cVar9 == '\0') {
    on_dec(this);
    goto LAB_00212a06;
  }
  uVar14 = this->abs_value;
  lVar8 = 0x3f;
  if ((uVar14 | 1) != 0) {
    for (; (uVar14 | 1) >> lVar8 == 0; lVar8 = lVar8 + -1) {
    }
  }
  uVar4 = *(ushort *)(bsr2log10(int)::data + (uint)((int)lVar8 * 2));
  bVar7 = uVar14 < *(ulong *)(basic_data<void>::zero_or_powers_of_10_64_new + (ulong)uVar4 * 8);
  uVar24 = (uint)uVar4 - (uint)bVar7;
  _Var16._M_p = local_298._M_dataplus._M_p;
  uVar22 = uVar24;
  uVar12 = uVar24;
  if (local_298._M_string_length == 0) {
LAB_002127b9:
    uVar19 = uVar12;
    uVar10 = uVar22;
    if (_Var16._M_p == local_298._M_dataplus._M_p + local_298._M_string_length) goto LAB_002127c4;
  }
  else {
    uVar19 = uVar24 + (int)local_298._M_string_length;
    sVar21 = local_298._M_string_length;
    do {
      cVar2 = *_Var16._M_p;
      uVar10 = uVar22 - (int)cVar2;
      if ((uVar10 == 0 || (int)uVar22 < (int)cVar2) || ((byte)(cVar2 + 0x81U) < 0x82))
      goto LAB_002127b9;
      uVar12 = uVar12 + 1;
      _Var16._M_p = _Var16._M_p + 1;
      sVar21 = sVar21 - 1;
      uVar22 = uVar10;
    } while (sVar21 != 0);
LAB_002127c4:
    uVar19 = (int)(uVar10 - 1) / (int)(local_298._M_dataplus._M_p + local_298._M_string_length)[-1]
             + uVar19;
  }
  pcVar17 = local_278 + (int)uVar24;
  uVar18 = uVar14;
  if (99 < uVar14) {
    do {
      uVar14 = uVar18 / 100;
      *(undefined2 *)(pcVar17 + -2) = *(undefined2 *)(basic_data<void>::digits + (uVar18 % 100) * 2)
      ;
      pcVar17 = pcVar17 + -2;
      bVar6 = 9999 < uVar18;
      uVar18 = uVar14;
    } while (bVar6);
  }
  if (uVar14 < 10) {
    pcVar17[-1] = (byte)uVar14 | 0x30;
  }
  else {
    *(undefined2 *)(pcVar17 + -2) = *(undefined2 *)(basic_data<void>::digits + uVar14 * 2);
  }
  local_248.super_buffer<char>.size_ = 0;
  local_248.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_0025a2a8;
  local_248.super_buffer<char>.ptr_ = local_248.store_;
  local_248.super_buffer<char>.capacity_ = 500;
  uVar19 = uVar19 + this->prefix_size;
  if (-1 < (int)uVar19) {
    uVar14 = (ulong)uVar19;
    if (500 < uVar19) {
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow(&local_248,uVar14);
    }
    pcVar17 = local_248.super_buffer<char>.ptr_;
    local_248.super_buffer<char>.size_ = local_248.super_buffer<char>.capacity_;
    if (uVar14 <= local_248.super_buffer<char>.capacity_) {
      local_248.super_buffer<char>.size_ = uVar14;
    }
    pcVar23 = local_248.super_buffer<char>.ptr_ + (uVar14 - 1);
    if (1 < (int)uVar24) {
      uVar18 = (ulong)uVar24;
      iVar20 = ((uint)uVar4 - (uint)bVar7) + 1;
      iVar13 = 0;
      _Var16._M_p = local_298._M_dataplus._M_p;
      do {
        uVar18 = uVar18 - 1;
        pcVar1 = pcVar23 + -1;
        *pcVar23 = local_278[uVar18 & 0xffffffff];
        cVar2 = *_Var16._M_p;
        if (0 < cVar2) {
          iVar13 = iVar13 + 1;
          if ((cVar2 != '\x7f') && (iVar13 % (int)cVar2 == 0)) {
            if (_Var16._M_p + 1 != local_298._M_dataplus._M_p + local_298._M_string_length) {
              iVar13 = 0;
              _Var16._M_p = _Var16._M_p + 1;
            }
            pcVar23[-1] = cVar9;
            pcVar1 = pcVar23 + -2;
          }
        }
        pcVar23 = pcVar1;
        iVar20 = iVar20 + -1;
      } while (2 < iVar20);
    }
    *pcVar23 = local_278[0];
    if (this->prefix_size != 0) {
      pcVar23[-1] = '-';
    }
    pbVar5 = this->specs;
    uVar18 = (ulong)pbVar5->width;
    if (-1 < (long)uVar18) {
      uVar15 = 0;
      if (uVar14 <= uVar18) {
        uVar15 = uVar18 - uVar14;
      }
      bVar11.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
           (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
      bVar3 = *(byte *)((long)&basic_data<void>::right_padding_shifts +
                       (ulong)((byte)pbVar5->field_0x9 & 0xf));
      if (*(ulong *)((long)bVar11.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                           container + 0x18) <
          *(long *)((long)bVar11.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                          container + 0x10) + uVar14 + (pbVar5->fill).size_ * uVar15) {
        (*(code *)**(undefined8 **)
                    bVar11.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                  (bVar11.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
      }
      uVar18 = uVar15 >> (bVar3 & 0x3f);
      bVar11 = fill<fmt::v7::detail::buffer_appender<char>,char>(bVar11,uVar18,&pbVar5->fill);
      bVar11 = std::__copy_move<false,false,std::random_access_iterator_tag>::
               __copy_m<char*,fmt::v7::detail::buffer_appender<char>>
                         (pcVar17,pcVar17 + uVar14,bVar11);
      bVar11 = fill<fmt::v7::detail::buffer_appender<char>,char>
                         (bVar11,uVar15 - uVar18,&pbVar5->fill);
      (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           (buffer<char> *)
           bVar11.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
      if (local_248.super_buffer<char>.ptr_ != local_248.store_) {
        operator_delete(local_248.super_buffer<char>.ptr_);
      }
LAB_00212a06:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p);
      }
      return;
    }
  }
  assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/include/fmt/core.h"
              ,0x146,"negative value");
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits, n = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && n > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      n -= *group;
      ++group;
    }
    if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
    char digits[40];
    format_decimal(digits, abs_value, num_digits);
    basic_memory_buffer<Char> buffer;
    size += static_cast<int>(prefix_size);
    const auto usize = to_unsigned(size);
    buffer.resize(usize);
    basic_string_view<Char> s(&sep, sep_size);
    // Index of a decimal digit with the least significant digit having index 0.
    int digit_index = 0;
    group = groups.cbegin();
    auto p = buffer.data() + size - 1;
    for (int i = num_digits - 1; i > 0; --i) {
      *p-- = static_cast<Char>(digits[i]);
      if (*group <= 0 || ++digit_index % *group != 0 ||
          *group == max_value<char>())
        continue;
      if (group + 1 != groups.cend()) {
        digit_index = 0;
        ++group;
      }
      std::uninitialized_copy(s.data(), s.data() + s.size(),
                              make_checked(p, s.size()));
      p -= s.size();
    }
    *p-- = static_cast<Char>(*digits);
    if (prefix_size != 0) *p = static_cast<Char>('-');
    auto data = buffer.data();
    out = write_padded<align::right>(
        out, specs, usize, usize,
        [=](iterator it) { return copy_str<Char>(data, data + size, it); });
  }